

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_Tetraloop37(char **content,size_t *line_no)

{
  size_t sVar1;
  int iVar2;
  bool local_29;
  char *buf;
  int r;
  int i;
  size_t *line_no_local;
  char **content_local;
  
  buf._4_4_ = 0;
  memset(Tetraloops,0,0x119);
  memset(Tetraloop37,0,0xa0);
  memset(TetraloopdH,0,0xa0);
  do {
    sVar1 = *line_no;
    *line_no = sVar1 + 1;
    if (content[sVar1] == (char *)0x0) {
      return;
    }
    iVar2 = __isoc99_sscanf(content[sVar1],"%6s %d %d",Tetraloops + buf._4_4_ * 7,
                            Tetraloop37 + buf._4_4_,TetraloopdH + buf._4_4_);
    strcat(Tetraloops," ");
    buf._4_4_ = buf._4_4_ + 1;
    local_29 = iVar2 == 3 && buf._4_4_ < 0x28;
  } while (local_29);
  return;
}

Assistant:

PRIVATE void
rd_Tetraloop37(char   **content,
               size_t *line_no)
{
  int   i, r;
  char  *buf;

  i = 0;
  /* erase old tetraloop entries */
  memset(&Tetraloops, 0, 281);
  memset(&Tetraloop37, 0, sizeof(int) * 40);
  memset(&TetraloopdH, 0, sizeof(int) * 40);
  do {
    buf = content[(*line_no)++];
    if (buf == NULL)
      break;

    r = sscanf(buf, "%6s %d %d", &Tetraloops[7 * i], &Tetraloop37[i], &TetraloopdH[i]);
    strcat(Tetraloops, " ");
    i++;
  } while ((r == 3) && (i < 40));
  return;
}